

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O3

void process(char *xmlFile)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  SchemaElementDecl *pSVar5;
  wchar16 *pwVar6;
  size_t sVar7;
  ulong uVar8;
  ContentSpecNode *cSpecNode;
  XMLAttDefList *attList;
  long lVar9;
  SchemaElementDecl *pSVar10;
  char *pcVar11;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> elemEnum;
  SAXParser parser;
  StrX local_180;
  StrX local_178;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> local_170;
  SAXParser local_138 [264];
  
  xercesc_4_0::SAXParser::SAXParser
            (local_138,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)local_138);
  xercesc_4_0::SAXParser::setDoNamespaces(SUB81(local_138,0));
  xercesc_4_0::SAXParser::setDoSchema(SUB81(local_138,0));
  xercesc_4_0::SAXParser::parse((char *)local_138);
  iVar3 = xercesc_4_0::SAXParser::getErrorCount();
  if (iVar3 == 0) {
    plVar4 = (long *)xercesc_4_0::SAXParser::getValidator();
    cVar2 = (**(code **)(*plVar4 + 0x68))(plVar4);
    if (cVar2 != '\0') {
      plVar4 = (long *)xercesc_4_0::SAXParser::getRootGrammar();
      if ((plVar4 == (long *)0x0) || (iVar3 = (**(code **)(*plVar4 + 0x28))(plVar4), iVar3 != 1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n Non schema grammar, no output available\n",0x2a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      else {
        xercesc_4_0::
        RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
        RefHash3KeysIdPoolEnumerator
                  (&local_170,
                   (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
                   plVar4[2],false,(MemoryManager *)plVar4[0xb]);
        if ((local_170.fCurIndex == 0) ||
           (*(ulong *)(local_170.fToEnum + 0x30) < local_170.fCurIndex)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nThe validator has no elements to display\n",0x2a);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
        }
        else {
          while ((local_170.fCurIndex != 0 &&
                 (local_170.fCurIndex <= *(ulong *)(local_170.fToEnum + 0x30)))) {
            pSVar5 = xercesc_4_0::
                     RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                     ::nextElement(&local_170);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Name:\t\t\t",8);
            pwVar6 = (wchar16 *)xercesc_4_0::QName::getRawName();
            pcVar11 = (char *)xercesc_4_0::XMLString::transcode
                                        (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            local_180.fLocalForm = pcVar11;
            if (pcVar11 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
            }
            else {
              sVar7 = strlen(pcVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar11,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            StrX::~StrX(&local_180);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Model Type:\t\t",0xd);
            pSVar10 = pSVar5 + 0x2c;
            if (*(long *)(pSVar5 + 0x50) != 0) {
              pSVar10 = (SchemaElementDecl *)(*(long *)(pSVar5 + 0x50) + 0x20);
            }
            uVar8 = (ulong)*(uint *)pSVar10;
            lVar9 = 7;
            pcVar11 = "Unknown";
            if (uVar8 < 7) {
              pcVar11 = &DAT_00107120 + *(int *)(&DAT_00107120 + uVar8 * 4);
              lVar9 = *(long *)(&DAT_00107140 + uVar8 * 8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Create Reason:\t",0xf);
            uVar8 = (ulong)*(uint *)(pSVar5 + 0x18);
            lVar9 = 7;
            pcVar11 = "Unknown";
            if (uVar8 < 6) {
              pcVar11 = &DAT_00107178 + *(int *)(&DAT_00107178 + uVar8 * 4);
              lVar9 = *(long *)(&DAT_00107190 + uVar8 * 8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            cSpecNode = (ContentSpecNode *)(**(code **)(*(long *)pSVar5 + 0x40))(pSVar5);
            processContentSpecNode(cSpecNode,false);
            uVar1 = *(uint *)(pSVar5 + 0x40);
            if (uVar1 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Misc. Flags:\t",0xd);
              if ((uVar1 & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Nillable ",9);
              }
              if ((uVar1 & 2) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Abstract ",9);
              }
              if ((uVar1 & 4) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fixed ",6)
                ;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            }
            lVar9 = *(long *)(pSVar5 + 0x70);
            if (lVar9 != 0) {
              pwVar6 = (wchar16 *)xercesc_4_0::SAXParser::getURIText((uint)local_138);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Substitution Name:\t",0x13);
              pcVar11 = (char *)xercesc_4_0::XMLString::transcode
                                          (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_180.fLocalForm = pcVar11;
              if (pcVar11 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
              }
              else {
                sVar7 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar11,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
              pcVar11 = (char *)xercesc_4_0::XMLString::transcode
                                          (*(wchar16 **)(*(long *)(lVar9 + 0x10) + 0x30),
                                           xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_178.fLocalForm = pcVar11;
              if (pcVar11 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
              }
              else {
                sVar7 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar11,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              StrX::~StrX(&local_178);
              StrX::~StrX(&local_180);
            }
            pwVar6 = (wchar16 *)(**(code **)(*(long *)pSVar5 + 0x68))(pSVar5);
            if (pwVar6 != (wchar16 *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Content Model:\t",0xf);
              pcVar11 = (char *)xercesc_4_0::XMLString::transcode
                                          (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_180.fLocalForm = pcVar11;
              if (pcVar11 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
              }
              else {
                sVar7 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar11,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              StrX::~StrX(&local_180);
            }
            lVar9 = *(long *)(pSVar5 + 0x50);
            if (lVar9 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ComplexType:\n",0xd);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\tTypeName:\t",0xb);
              pcVar11 = (char *)xercesc_4_0::XMLString::transcode
                                          (*(wchar16 **)(lVar9 + 0x30),
                                           xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_180.fLocalForm = pcVar11;
              if (pcVar11 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
              }
              else {
                sVar7 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar11,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              StrX::~StrX(&local_180);
              processContentSpecNode(*(ContentSpecNode **)(lVar9 + 0x60),true);
            }
            processDatatypeValidator(*(DatatypeValidator **)(pSVar5 + 0x78),false);
            cVar2 = (**(code **)(*(long *)pSVar5 + 0x38))(pSVar5);
            if (cVar2 != '\0') {
              attList = (XMLAttDefList *)(**(code **)(*(long *)pSVar5 + 0x28))(pSVar5);
              processAttributes(attList,false);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"--------------------------------------------",0x2c);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
          }
        }
        xercesc_4_0::
        RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
        ~RefHash3KeysIdPoolEnumerator(&local_170);
      }
      goto LAB_001047ed;
    }
    lVar9 = 0x2b;
    pcVar11 = "\n Non schema document, no output available\n";
  }
  else {
    lVar9 = 0x26;
    pcVar11 = "\nErrors occurred, no output available\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
LAB_001047ed:
  xercesc_4_0::SAXParser::~SAXParser(local_138);
  return;
}

Assistant:

void process(char* const xmlFile)
{
    //
    //  Create a Schema validator to be used for our validation work. Then create
    //  a SAX parser object and pass it our validator. Then, according to what
    //  we were told on the command line, set it to validate or not. He owns
    //  the validator, so we have to allocate it.
    //
    SAXParser parser;
    parser.setValidationScheme(SAXParser::Val_Always);
    parser.setDoNamespaces(true);
    parser.setDoSchema(true);

	parser.parse(xmlFile);

    if (parser.getErrorCount())
	{
        std::cout << "\nErrors occurred, no output available\n" << std::endl;
		return;
	}

	if (!parser.getValidator().handlesSchema())
	{
		std::cout << "\n Non schema document, no output available\n" << std::endl;
		return;
	}

	Grammar* rootGrammar = parser.getRootGrammar();
	if (!rootGrammar || rootGrammar->getGrammarType() != Grammar::SchemaGrammarType)
	{
		std::cout << "\n Non schema grammar, no output available\n" << std::endl;
		return;
	}

	//
	//  Now we will get an enumerator for the element pool from the validator
	//  and enumerate the elements, printing them as we go. For each element
	//  we get an enumerator for its attributes and print them also.
	//

	SchemaGrammar* grammar = (SchemaGrammar*) rootGrammar;
	RefHash3KeysIdPoolEnumerator<SchemaElementDecl> elemEnum = grammar->getElemEnumerator();

	if (!elemEnum.hasMoreElements())
	{
		std::cout << "\nThe validator has no elements to display\n" << std::endl;
		return;
	}

	while(elemEnum.hasMoreElements())
	{
		const SchemaElementDecl& curElem = elemEnum.nextElement();

		// Name
		std::cout << "Name:\t\t\t" << StrX(curElem.getFullName()) << "\n";

		// Model Type
		std::cout << "Model Type:\t\t";
		switch( curElem.getModelType() )
		{
		case SchemaElementDecl::Empty:          std::cout << "Empty";         break;
		case SchemaElementDecl::Any:            std::cout << "Any";           break;
		case SchemaElementDecl::Mixed_Simple:   std::cout << "Mixed_Simple";  break;
		case SchemaElementDecl::Mixed_Complex:  std::cout << "Mixed_Complex"; break;
		case SchemaElementDecl::Children:       std::cout << "Children";      break;
		case SchemaElementDecl::Simple:         std::cout << "Simple";        break;
        case SchemaElementDecl::ElementOnlyEmpty:    std::cout << "ElementOnlyEmpty";    break;

		default:                                std::cout << "Unknown";       break;
		}

		std::cout << "\n";

		// Create Reason
		std::cout << "Create Reason:\t";
		switch( curElem.getCreateReason() )
		{
		case XMLElementDecl::NoReason:          std::cout << "Empty";            break;
		case XMLElementDecl::Declared:          std::cout << "Declared";         break;
		case XMLElementDecl::AttList:           std::cout << "AttList";          break;
		case XMLElementDecl::InContentModel:    std::cout << "InContentModel";   break;
		case XMLElementDecl::AsRootElem:        std::cout << "AsRootElem";       break;
		case XMLElementDecl::JustFaultIn:       std::cout << "JustFaultIn";      break;

		default:                            std::cout << "Unknown";  break;
		}

		std::cout << "\n";

		// Content Spec Node
		processContentSpecNode( curElem.getContentSpec() );

		// Misc Flags
		int mflags = curElem.getMiscFlags();
		if( mflags !=0 )
		{
			std::cout << "Misc. Flags:\t";
		}

        if ( mflags & SchemaSymbols::XSD_NILLABLE )
			std::cout << "Nillable ";

		if ( mflags & SchemaSymbols::XSD_ABSTRACT )
			std::cout << "Abstract ";

		if ( mflags & SchemaSymbols::XSD_FIXED )
			std::cout << "Fixed ";

		if( mflags !=0 )
		{
			std::cout << "\n";
		}

		// Substitution Name
		SchemaElementDecl* subsGroup = curElem.getSubstitutionGroupElem();
		if( subsGroup )
		{
			const XMLCh* uriText = parser.getURIText(subsGroup->getURI());
			std::cout << "Substitution Name:\t" << StrX(uriText)
			     << "," << StrX(subsGroup->getBaseName()) << "\n";
		}

		// Content Model
		const XMLCh* fmtCntModel = curElem.getFormattedContentModel();
		if( fmtCntModel != NULL )
		{
			std::cout << "Content Model:\t" << StrX(fmtCntModel) << "\n";
		}

		const ComplexTypeInfo* ctype = curElem.getComplexTypeInfo();
		if( ctype != NULL)
		{
			std::cout << "ComplexType:\n";
			std::cout << "\tTypeName:\t" << StrX(ctype->getTypeName()) << "\n";

			ContentSpecNode* cSpecNode = ctype->getContentSpec();
			processContentSpecNode(cSpecNode, true );
		}

		// Datatype
		DatatypeValidator* dtValidator = curElem.getDatatypeValidator();
		processDatatypeValidator( dtValidator );

		// Get an enumerator for this guy's attributes if any
		if ( curElem.hasAttDefs() )
		{
			processAttributes( curElem.getAttDefList() );
		}

		std::cout << "--------------------------------------------";
		std::cout << std::endl;

    }

    return;
}